

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O0

void Abc_FlowRetime_ConstrainExact_forw_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vNodes,int latch)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int local_2c;
  int i;
  Abc_Obj_t *pNext;
  int latch_local;
  Vec_Ptr_t *vNodes_local;
  Abc_Obj_t *pObj_local;
  
  iVar1 = Abc_ObjIsLatch(pObj);
  pNext._4_4_ = latch;
  if (iVar1 != 0) {
    if (latch != 0) {
      return;
    }
    pNext._4_4_ = 1;
  }
  if (pNext._4_4_ == 0) {
    if ((*(uint *)&pObj->field_0x14 >> 4 & 1) != 0) {
      return;
    }
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffef | 0x10;
  }
  else {
    if ((*(uint *)&pObj->field_0x14 >> 5 & 1) != 0) {
      return;
    }
    *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xffffffdf | 0x20;
  }
  for (local_2c = 0; iVar1 = Abc_ObjFaninNum(pObj), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar2 = Abc_ObjFanin(pObj,local_2c);
    Abc_FlowRetime_ConstrainExact_forw_rec(pAVar2,vNodes,pNext._4_4_);
  }
  *(uint *)&pObj->field_0x14 = *(uint *)&pObj->field_0x14 & 0xfff;
  pAVar2 = Abc_ObjNotCond(pObj,pNext._4_4_);
  Vec_PtrPush(vNodes,pAVar2);
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExact_forw_rec( Abc_Obj_t * pObj, Vec_Ptr_t *vNodes, int latch ) {
  Abc_Obj_t *pNext;
  int i;

  // terminate?
  if (Abc_ObjIsLatch(pObj)) {
    if (latch) return;
    latch = 1;
  }

  // already visited?
  if (!latch) {
    if (pObj->fMarkA) return;
    pObj->fMarkA = 1;
  } else {
    if (pObj->fMarkB) return;
    pObj->fMarkB = 1;
  }

  // recurse
  Abc_ObjForEachFanin(pObj, pNext, i) {
    Abc_FlowRetime_ConstrainExact_forw_rec( pNext, vNodes, latch );
  }

  // add
  pObj->Level = 0;
  Vec_PtrPush(vNodes, Abc_ObjNotCond(pObj, latch));
}